

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::StackLayerParams::Clear(StackLayerParams *this)

{
  uint32_t cached_has_bits;
  StackLayerParams *this_local;
  
  this->axis_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void StackLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.StackLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  axis_ = int64_t{0};
  _internal_metadata_.Clear<std::string>();
}